

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ptc::Print<char>::operator()
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Print<char> *this,mode *first,
          multimap<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *args)

{
  int iVar1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*first == str) {
    if (operator()<std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>(ptc::mode&&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&)
        ::oss_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&operator()<std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>(ptc::mode&&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&)
                                   ::oss_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &operator()<std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>(ptc::mode&&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&)
                    ::oss_abi_cxx11_);
        __cxa_atexit(std::__cxx11::ostringstream::~ostringstream,
                     &operator()<std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>(ptc::mode&&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&)
                      ::oss_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&operator()<std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>(ptc::mode&&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&)
                             ::oss_abi_cxx11_);
      }
    }
    s_abi_cxx11_(&local_40,"",0);
    std::__cxx11::stringbuf::str((string *)&DAT_00155478);
    std::__cxx11::string::~string((string *)&local_40);
    std::ios::clear((int)*(undefined8 *)
                          (operator()<std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>(ptc::mode&&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&)
                           ::oss_abi_cxx11_ + -0x18) + 0x155470);
    print_backend<std::__cxx11::ostringstream&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>
              (this,(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &operator()<std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&>(ptc::mode&&,std::multimap<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>&)
                     ::oss_abi_cxx11_,args);
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::basic_string<T_str> operator()( mode&& first, Args&&... args ) const
     { 
      if constexpr( sizeof...( args ) > 0 )
       {
        switch( first )
         {
          case mode::str:
           {
            static std::basic_ostringstream<T_str> oss;
            oss.str( StringConverter<T_str>( ""s ) );
            oss.clear();
            print_backend( oss, std::forward<Args>( args )... );

            return oss.str();
           }
         }
       }
       
      return StringConverter<T_str>( "" );
     }